

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall jsonnet::internal::FixNewlines::expandBetween(FixNewlines *this,ArgParams *params)

{
  pointer pAVar1;
  bool bVar2;
  Fodder *fodder;
  ArgParam *param;
  pointer param_00;
  
  pAVar1 = (params->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (param_00 = (params->
                  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  )._M_impl.super__Vector_impl_data._M_start; param_00 != pAVar1;
      param_00 = param_00 + 1) {
    if (!bVar2) {
      fodder = argParamOpenFodder(this,param_00);
      ensureCleanNewline(fodder);
    }
    bVar2 = false;
  }
  return;
}

Assistant:

void expandBetween(ArgParams &params)
    {
        bool first = true;
        for (auto &param : params) {
            if (!first) {
                ensureCleanNewline(argParamOpenFodder(param));
            }
            first = false;
        }
    }